

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

bool filesystem::create_subdirectory(path *p)

{
  pointer ppVar1;
  path *this;
  bool bVar2;
  path *ppVar3;
  vector<filesystem::path,_std::allocator<filesystem::path>_> hierarchy;
  path tmp;
  vector<filesystem::path,_std::allocator<filesystem::path>_> local_98;
  path local_80;
  path local_58;
  
  path::path(&local_80,p);
  local_98.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_start = (path *)0x0;
  local_98.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_finish = (path *)0x0;
  while (this = local_98.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>.
                _M_impl.super__Vector_impl_data._M_finish,
        local_80.m_path.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_80.m_path.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<filesystem::path,_std::allocator<filesystem::path>_>::push_back(&local_98,&local_80)
    ;
    path::parent_path(&local_58,&local_80);
    path::operator=(&local_80,&local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58.m_path);
  }
  do {
    ppVar3 = this;
    ppVar1 = local_98.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (ppVar3 == local_98.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>.
                  _M_impl.super__Vector_impl_data._M_start) break;
    this = ppVar3 + -1;
    bVar2 = path::exists(this);
  } while ((bVar2) || (bVar2 = create_directory(this), bVar2));
  std::vector<filesystem::path,_std::allocator<filesystem::path>_>::~vector(&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80.m_path);
  return ppVar3 == ppVar1;
}

Assistant:

inline bool create_subdirectory(const path& p) {
    auto tmp = p;
    std::vector<path> hierarchy;
    while (!tmp.empty()) {
        hierarchy.push_back(tmp);
        tmp = tmp.parent_path();
    }

    for (auto ancestor = hierarchy.rbegin(); ancestor != hierarchy.rend(); ++ancestor) {
        if (ancestor->exists())
            continue;
        if (!create_directory(*ancestor))
            return false;
    }

    return true;
}